

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O2

void __thiscall
check_if_boundary_of_boundary_is_zero_periodic_case_2d::test_method
          (check_if_boundary_of_boundary_is_zero_periodic_case_2d *this)

{
  ostream *poVar1;
  pointer puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  pointer puVar6;
  long lVar7;
  Boundary_range second_bdrange;
  vector<int,_std::allocator<int>_> elems_in_boundary;
  Boundary_range bdrange;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 local_130 [8];
  undefined8 local_128;
  shared_count sStack_120;
  vector<double,_std::allocator<double>_> data;
  vector<bool,_std::allocator<bool>_> directions_of_periodicity;
  Bitmap_cubical_complex_periodic_boundary_conditions ba;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&sizes,2,(allocator_type *)&ba);
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 3;
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
  super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base =
       (_func_int **)
       CONCAT71(ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
                super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base._1_7_,1)
  ;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&directions_of_periodicity,2,(bool *)&ba,(allocator_type *)&second_bdrange);
  ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
  super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base = (_func_int **)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&data,9,(value_type_conflict2 *)&ba,(allocator_type *)&second_bdrange);
  ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
  super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base =
       (_func_int **)
       ((ulong)ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
               super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base &
       0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&elems_in_boundary,
             (long)(int)(*sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start *
                         sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[1] * 4),
             (value_type_conflict4 *)&ba,(allocator_type *)&second_bdrange);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
  ::Bitmap_cubical_complex(&ba,&sizes,&data,&directions_of_periodicity,true);
  for (lVar7 = 0;
      lVar7 != (long)ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
                     super_Bitmap_cubical_complex_base<double>.data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
                     super_Bitmap_cubical_complex_base<double>.data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3; lVar7 = lVar7 + 1) {
    poVar1 = std::operator<<((ostream *)&std::clog,"Element : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    (*ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
      super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base[2])
              (&bdrange,&ba,lVar7);
    iVar3 = 1;
    for (puVar6 = bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar6 != bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::operator<<(poVar1," ");
      (*ba.super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>.
        super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base[2])
                (&second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                 &ba,*puVar6);
      iVar5 = 1;
      for (puVar2 = second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 != (pointer)CONCAT71(second_bdrange.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                      second_bdrange.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_1_);
          puVar2 = puVar2 + 1) {
        elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[*puVar2] =
             elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[*puVar2] + iVar5 * iVar3;
        iVar5 = -iVar5;
      }
      iVar3 = -iVar3;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    for (lVar4 = 0;
        lVar4 != (long)elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2; lVar4 = lVar4 + 1) {
      local_140 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
      ;
      local_138 = "";
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x46a,&local_150)
      ;
      local_130[0] = elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4] == 0;
      local_128 = 0;
      sStack_120.pi_ = (sp_counted_base *)0x0;
      local_160 = "elems_in_boundary[i] == 0";
      local_158 = "";
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00122ba8;
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &boost::unit_test::lazy_ostream::inst;
      local_170 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
      ;
      local_168 = "";
      boost::test_tools::tt_detail::report_assertion
                (local_130,
                 &second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                 &local_170,0x46a,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_120);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
  ::~Bitmap_cubical_complex(&ba);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&directions_of_periodicity.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_if_boundary_of_boundary_is_zero_periodic_case_2d) {
  std::vector<unsigned> sizes(2);
  sizes[0] = 3;
  sizes[1] = 3;

  std::vector<bool> directions_of_periodicity(2, true);
  std::vector<double> data(9, 0);

  int number_of_all_elements = (2 * sizes[0]) * (2 * sizes[1]);  // *(2*sizes[2]);
  std::vector<int> elems_in_boundary(number_of_all_elements, 0);
  Bitmap_cubical_complex_periodic_boundary_conditions ba(sizes, data, directions_of_periodicity);
  for (auto it = ba.all_cells_iterator_begin();
       it != ba.all_cells_iterator_end(); ++it) {    
    int i = 1;
    std::clog << "Element : " << *it << std::endl;
    Bitmap_cubical_complex_periodic_boundary_conditions_base::Boundary_range bdrange = ba.boundary_range(*it);
    for (auto bd = bdrange.begin();
         bd != bdrange.end(); ++bd) {
      std::clog <<  *bd << " ";
      Bitmap_cubical_complex_periodic_boundary_conditions::Boundary_range second_bdrange = ba.boundary_range(*bd);
      int j = 1;
      for (auto bd2 = second_bdrange.begin();
           bd2 != second_bdrange.end(); ++bd2) {
        elems_in_boundary[*bd2] += i * j;
        j *= -1;
      }
      i *= -1;
    }
    // getchar();

    // check if there is anything nonzero in elems_in_boundary
    for (size_t i = 0; i != elems_in_boundary.size(); ++i) {
      BOOST_CHECK(elems_in_boundary[i] == 0);
    }
  }
}